

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_values.cpp
# Opt level: O3

ON_ScaleValue *
ON_ScaleValue::CreateFromSubString
          (ON_ScaleValue *__return_storage_ptr__,ON_ParseSettings parse_settings,wchar_t *string,
          int string_count,wchar_t **string_end)

{
  wchar_t wVar1;
  ON_ParseSettings parse_settings_00;
  wchar_t *pwVar2;
  bool bVar3;
  LengthUnitSystem LVar4;
  int iVar5;
  wchar_t *string_00;
  int iVar6;
  int iVar7;
  ON_ScaleValue *this;
  ulong uVar8;
  double dVar9;
  wchar_t *right_side_string_end;
  wchar_t *left_side_string_end;
  ON_ParseSettings right_side_parse_settings;
  ON_LengthValue right_side;
  ON_LengthValue left_side;
  ON_ScaleValue scale_value;
  ScaleStringFormat local_152;
  wchar_t *local_150;
  double local_148;
  wchar_t *local_140;
  ON_ParseSettings local_138;
  ON_LengthValue local_110;
  ON_LengthValue local_e0;
  undefined1 local_b0 [128];
  
  if (string_end != (wchar_t **)0x0) {
    *string_end = string;
  }
  if (string_count < -1) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x4b4,"","Invalid string_count parameter.");
LAB_005c142a:
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    return __return_storage_ptr__;
  }
  if ((string_count == 0 || string == (wchar_t *)0x0) || (*string == L'\0')) goto LAB_005c142a;
  local_140 = (wchar_t *)0x0;
  ON_LengthValue::CreateFromSubString(&local_e0,parse_settings,string,string_count,&local_140);
  bVar3 = ON_LengthValue::IsSet(&local_e0);
  if (!bVar3 || (local_140 < string || (long)local_140 - (long)string == 0)) {
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    goto LAB_005c1766;
  }
  if (string_count == -1) {
    iVar6 = -1;
  }
  else {
    iVar6 = string_count - (int)((ulong)((long)local_140 - (long)string) >> 2);
    if (iVar6 < 0) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x4cd,"","Invalid input parameters.");
      ON_ScaleValue(__return_storage_ptr__,&Unset);
      goto LAB_005c1766;
    }
  }
  local_148 = local_e0.m_length;
  LVar4 = ON_UnitSystem::UnitSystem(&local_e0.m_length_unit_system);
  pwVar2 = local_140;
  local_152 = Unset;
  string_00 = pwVar2;
  if (iVar6 == -1 || 0 < iVar6) {
    uVar8 = 1;
    do {
      bVar3 = ON_ParseSettings::IsInteriorWhiteSpace(&parse_settings,pwVar2[uVar8 - 1]);
      iVar7 = (int)uVar8;
      if (!bVar3) {
        wVar1 = pwVar2[uVar8 - 1];
        if (wVar1 == L'/') {
          local_152 = FractionFormat;
          goto LAB_005c1800;
        }
        if (wVar1 == L':') {
          local_152 = RatioFormat;
          goto LAB_005c1800;
        }
        if (wVar1 == L'=') {
          local_152 = EquationFormat;
          goto LAB_005c1800;
        }
        local_152 = Unset;
        goto LAB_005c1841;
      }
      uVar8 = uVar8 + 1;
    } while (iVar7 < iVar6 || iVar6 == -1);
  }
LAB_005c14d4:
  iVar5 = (int)((ulong)((long)string_00 - (long)pwVar2) >> 2);
  iVar7 = iVar6 - iVar5;
  if (iVar7 == 0 || iVar6 < iVar5) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
               ,0x4ff,"","Invalid input parameters.");
    ON_ScaleValue(__return_storage_ptr__,&Unset);
    goto LAB_005c1766;
  }
  goto LAB_005c14e6;
  while( true ) {
    bVar3 = ON_ParseSettings::IsInteriorWhiteSpace(&parse_settings,pwVar2[uVar8]);
    uVar8 = uVar8 + 1;
    if (!bVar3) break;
LAB_005c1800:
    if (iVar6 <= (int)uVar8 && iVar6 != -1) {
      string_00 = pwVar2 + (uVar8 & 0xffffffff);
      goto LAB_005c14d4;
    }
  }
  iVar7 = (int)uVar8;
LAB_005c1841:
  string_00 = pwVar2 + (iVar7 + -1);
  if (iVar6 != -1) goto LAB_005c14d4;
  iVar7 = -1;
LAB_005c14e6:
  local_110.m_context_locale_id = 0;
  local_110.m_context_angle_unit_system = Unset;
  local_110.m_string_format = ExactDecimal;
  local_110.m_length_unit_system.m_unit_system = ON_UnitSystem::Unset.m_unit_system;
  local_110.m_length_unit_system._1_3_ = ON_UnitSystem::Unset._1_3_;
  local_110.m_length_unit_system.m_reserved = ON_UnitSystem::Unset.m_reserved;
  local_110.m_length_unit_system.m_meters_per_custom_unit =
       ON_UnitSystem::Unset.m_meters_per_custom_unit;
  local_150 = string_00;
  ON_wString::ON_wString
            (&local_110.m_length_unit_system.m_custom_unit_name,
             &ON_UnitSystem::Unset.m_custom_unit_name);
  local_110.m_length = ON_DBL_QNAN;
  ON_wString::ON_wString(&local_110.m_length_as_string);
  if (local_152 == Unset) {
    if (LVar4 == None) {
      ON_LengthValue::Create((ON_LengthValue *)local_b0,1.0,None,0,ExactDecimal);
      ON_LengthValue::operator=(&local_110,(ON_LengthValue *)local_b0);
      ON_wString::~ON_wString((ON_wString *)(local_b0 + 0x28));
      ON_wString::~ON_wString((ON_wString *)(local_b0 + 0x18));
      dVar9 = floor(local_148);
      local_152 = EquationFormat - (local_148 == dVar9);
      goto LAB_005c15c8;
    }
LAB_005c16fb:
    ON_ScaleValue(__return_storage_ptr__,&Unset);
  }
  else {
    local_138.m_reserved_bits = parse_settings.m_reserved_bits;
    local_138.m_context_locale_id = parse_settings.m_context_locale_id;
    local_138.m_context_angle_unit_system = parse_settings.m_context_angle_unit_system;
    local_138.m_context_length_unit_system = parse_settings.m_context_length_unit_system;
    local_138.m_reserved = parse_settings.m_reserved;
    local_138.m_true_default_bits[0] = parse_settings.m_true_default_bits[0];
    local_138.m_true_default_bits[1] = parse_settings.m_true_default_bits[1];
    local_138.m_false_default_bits[0] = parse_settings.m_false_default_bits[0];
    local_138.m_false_default_bits[1] = parse_settings.m_false_default_bits[1];
    ON_ParseSettings::SetParseLeadingWhiteSpace(&local_138,false);
    parse_settings_00.m_false_default_bits[0] = local_138.m_false_default_bits[0];
    parse_settings_00.m_false_default_bits[1] = local_138.m_false_default_bits[1];
    parse_settings_00.m_true_default_bits[0] = local_138.m_true_default_bits[0];
    parse_settings_00.m_true_default_bits[1] = local_138.m_true_default_bits[1];
    parse_settings_00.m_reserved_bits = local_138.m_reserved_bits;
    parse_settings_00.m_context_locale_id = local_138.m_context_locale_id;
    parse_settings_00.m_context_angle_unit_system = local_138.m_context_angle_unit_system;
    parse_settings_00.m_context_length_unit_system = local_138.m_context_length_unit_system;
    parse_settings_00.m_reserved = local_138.m_reserved;
    ON_LengthValue::CreateFromSubString
              ((ON_LengthValue *)local_b0,parse_settings_00,string_00,iVar7,&local_150);
    ON_LengthValue::operator=(&local_110,(ON_LengthValue *)local_b0);
    ON_wString::~ON_wString((ON_wString *)(local_b0 + 0x28));
    ON_wString::~ON_wString((ON_wString *)(local_b0 + 0x18));
LAB_005c15c8:
    bVar3 = ON_LengthValue::IsSet(&local_110);
    if (!bVar3) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x51e,"","Invalid input parameters.");
      goto LAB_005c16fb;
    }
    Create((ON_ScaleValue *)local_b0,&local_e0,&local_110,local_152);
    this = (ON_ScaleValue *)local_b0;
    bVar3 = IsSet(this);
    if ((bVar3) && (string <= local_150 && (long)local_150 - (long)string != 0)) {
      ON_wString::ON_wString
                ((ON_wString *)&local_138,string,(int)((ulong)((long)local_150 - (long)string) >> 2)
                );
      ON_wString::operator=((ON_wString *)(local_b0 + 0x18),(ON_wString *)&local_138);
      ON_wString::~ON_wString((ON_wString *)&local_138);
      ON_wString::TrimLeftAndRight((ON_wString *)(local_b0 + 0x18),(wchar_t *)0x0);
      if (string_end != (wchar_t **)0x0) {
        *string_end = local_150;
      }
    }
    else {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_string_values.cpp"
                 ,0x52a,"","Invalid input parameters.");
      this = &Unset;
    }
    ON_ScaleValue(__return_storage_ptr__,this);
    ~ON_ScaleValue((ON_ScaleValue *)local_b0);
  }
  ON_wString::~ON_wString(&local_110.m_length_as_string);
  ON_wString::~ON_wString(&local_110.m_length_unit_system.m_custom_unit_name);
LAB_005c1766:
  ON_wString::~ON_wString(&local_e0.m_length_as_string);
  ON_wString::~ON_wString(&local_e0.m_length_unit_system.m_custom_unit_name);
  return __return_storage_ptr__;
}

Assistant:

ON_ScaleValue ON_ScaleValue::CreateFromSubString(
  ON_ParseSettings parse_settings,
  const wchar_t* string,
  int string_count,
  const wchar_t** string_end
)
{
  // All calls to some version of ON_AngleValue::CreateFrom*String(...) end up here.
  if (nullptr != string_end && &string != string_end)
    *string_end = string;

  if (string_count < -1)
  {
    ON_ERROR("Invalid string_count parameter.");
    return ON_ScaleValue::Unset;
  }

  if (nullptr == string || 0 == string_count || 0 == string[0] )
  {
    // empty string fails silently.
    return ON_ScaleValue::Unset;
  }

  const wchar_t* left_side_string_end = nullptr;
  ON_ParseSettings left_side_parse_settings = parse_settings;

  const ON_LengthValue left_side = ON_LengthValue::CreateFromSubString( left_side_parse_settings, string, string_count, &left_side_string_end);

  if (left_side.IsUnset() || nullptr == left_side_string_end || !(string < left_side_string_end))
    return ON_ScaleValue::Unset;

  const size_t left_side_count = left_side_string_end - string;
  if ( -1 != string_count )
  {
    string_count -= (int)left_side_count;
    // 0 = string_count may be ok - conditions checked later.
    if (string_count < 0)
    {
      ON_ERROR("Invalid input parameters.");
      return ON_ScaleValue::Unset;
    }
  }

  const double left_side_length = left_side.Length(ON::LengthUnitSystem::None);
  const ON::LengthUnitSystem left_side_unit_system = left_side.LengthUnitSystem().UnitSystem();

  // look for equal, colon or fraction;
  ON_ScaleValue::ScaleStringFormat format_preference = ON_ScaleValue::ScaleStringFormat::Unset;
  const wchar_t* separator_string = left_side_string_end;
  const wchar_t* separator_string_end = separator_string;
  for (int i = 0; -1 == string_count || i < string_count; i++)
  {
    if (parse_settings.IsInteriorWhiteSpace(separator_string[i]))
      continue;

    switch (separator_string[i])
    {
    case ':':
      format_preference = ON_ScaleValue::ScaleStringFormat::RatioFormat;
      break;

    case '=':
      format_preference = ON_ScaleValue::ScaleStringFormat::EquationFormat;
      break;

    case '/':
      format_preference = ON_ScaleValue::ScaleStringFormat::FractionFormat;
      break;
    }

    if (ON_ScaleValue::ScaleStringFormat::Unset != format_preference)
    {
      for (i++; -1 == string_count || i < string_count; i++)
      {
        if (false == parse_settings.IsInteriorWhiteSpace(separator_string[i]))
          break;
      }
    }
    separator_string_end = separator_string + i;
    break;
  }

  const size_t separator_count = separator_string_end - separator_string;
  if ( -1 != string_count )
  {
    string_count -= (int)separator_count;
    if (string_count <= 0)
    {
      ON_ERROR("Invalid input parameters.");
      return ON_ScaleValue::Unset;
    }
  }

  const wchar_t* right_side_string = separator_string_end;
  const wchar_t* right_side_string_end = right_side_string;
  ON_LengthValue right_side;

  if (ON_ScaleValue::ScaleStringFormat::Unset == format_preference)
  {
    // A single value scanned.
    if (ON::LengthUnitSystem::None != left_side_unit_system)
      return ON_ScaleValue::Unset;
    right_side = ON_LengthValue::Create(1.0, ON::LengthUnitSystem::None, 0, ON_LengthValue::StringFormat::ExactDecimal);

    format_preference
      = (left_side_length == floor(left_side_length) && ON::LengthUnitSystem::None == left_side_unit_system)
        ? ON_ScaleValue::ScaleStringFormat::RatioFormat
        : ON_ScaleValue::ScaleStringFormat::EquationFormat;
  }
  else
  {
    // parse right side
    ON_ParseSettings right_side_parse_settings = parse_settings;
    right_side_parse_settings.SetParseLeadingWhiteSpace(false);
    right_side = ON_LengthValue::CreateFromSubString( right_side_parse_settings, right_side_string, string_count, &right_side_string_end );
  }

  if (right_side.IsUnset())
  {
    ON_ERROR("Invalid input parameters.");
    return ON_ScaleValue::Unset;
  }

  ON_ScaleValue scale_value = ON_ScaleValue::Create(
    left_side,
    right_side,
    format_preference
  );

  if (scale_value.IsUnset() || !(right_side_string_end > string))
  {
    ON_ERROR("Invalid input parameters.");
    return ON_ScaleValue::Unset;
  }

  scale_value.m_scale_as_string = ON_wString(string, (int)(right_side_string_end - string));
  scale_value.m_scale_as_string.TrimLeftAndRight();

  if (nullptr != string_end)
    *string_end = right_side_string_end;

  return scale_value;
}